

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_gated_linear_attn
          (ggml_context *ctx,ggml_tensor *k,ggml_tensor *v,ggml_tensor *q,ggml_tensor *g,
          ggml_tensor *state,float scale)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  long lVar4;
  ggml_tensor *pgVar5;
  char *pcVar6;
  int line;
  int64_t ne [4];
  
  _Var3 = ggml_is_contiguous_0(k);
  if (_Var3) {
    _Var3 = ggml_is_contiguous_0(v);
    if (_Var3) {
      _Var3 = ggml_is_contiguous_0(q);
      if (_Var3) {
        _Var3 = ggml_is_contiguous_0(g);
        if (_Var3) {
          _Var3 = ggml_is_contiguous_0(state);
          if (_Var3) {
            lVar4 = k->ne[0];
            if (((v->ne[0] == lVar4) && (lVar1 = k->ne[1], v->ne[1] == lVar1)) &&
               (lVar2 = k->ne[2], v->ne[2] == lVar2)) {
              if (((q->ne[0] == lVar4) && (q->ne[1] == lVar1)) && (q->ne[2] == lVar2)) {
                if (((g->ne[0] == lVar4) && (g->ne[1] == lVar1)) && (g->ne[2] == lVar2)) {
                  ne[0] = lVar1 * lVar4;
                  lVar4 = lVar4 * state->ne[1];
                  if (state->ne[0] * state->ne[1] * state->ne[2] * state->ne[3] - ne[0] * lVar4 == 0
                     ) {
                    ne[1] = lVar4 + lVar2;
                    ne[2] = 1;
                    ne[3] = 1;
                    pgVar5 = ggml_new_tensor(ctx,GGML_TYPE_F32,4,ne);
                    pgVar5->op_params[0] = (int32_t)scale;
                    pgVar5->op = GGML_OP_GATED_LINEAR_ATTN;
                    pgVar5->src[0] = k;
                    pgVar5->src[1] = v;
                    pgVar5->src[2] = q;
                    pgVar5->src[3] = g;
                    pgVar5->src[4] = state;
                    return pgVar5;
                  }
                  pcVar6 = "ggml_nelements(state) == S * S * H * n_seqs";
                  line = 0x12b5;
                }
                else {
                  pcVar6 = "g->ne[0] == S && g->ne[1] == H && g->ne[2] == n_tokens";
                  line = 0x12b4;
                }
              }
              else {
                pcVar6 = "q->ne[0] == S && q->ne[1] == H && q->ne[2] == n_tokens";
                line = 0x12b3;
              }
            }
            else {
              pcVar6 = "v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens";
              line = 0x12b2;
            }
          }
          else {
            pcVar6 = "ggml_is_contiguous(state)";
            line = 0x12ab;
          }
        }
        else {
          pcVar6 = "ggml_is_contiguous(g)";
          line = 0x12aa;
        }
      }
      else {
        pcVar6 = "ggml_is_contiguous(q)";
        line = 0x12a9;
      }
    }
    else {
      pcVar6 = "ggml_is_contiguous(v)";
      line = 0x12a8;
    }
  }
  else {
    pcVar6 = "ggml_is_contiguous(k)";
    line = 0x12a7;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar6);
}

Assistant:

struct ggml_tensor * ggml_gated_linear_attn(
        struct ggml_context * ctx,
        struct ggml_tensor  * k,
        struct ggml_tensor  * v,
        struct ggml_tensor  * q,
        struct ggml_tensor  * g,
        struct ggml_tensor  * state,
        float scale) {
    GGML_ASSERT(ggml_is_contiguous(k));
    GGML_ASSERT(ggml_is_contiguous(v));
    GGML_ASSERT(ggml_is_contiguous(q));
    GGML_ASSERT(ggml_is_contiguous(g));
    GGML_ASSERT(ggml_is_contiguous(state));

    const int64_t S = k->ne[0];
    const int64_t H = k->ne[1];
    const int64_t n_tokens = k->ne[2];
    const int64_t n_seqs = state->ne[1];
    {
        GGML_ASSERT(v->ne[0] == S && v->ne[1] == H && v->ne[2] == n_tokens);
        GGML_ASSERT(q->ne[0] == S && q->ne[1] == H && q->ne[2] == n_tokens);
        GGML_ASSERT(g->ne[0] == S && g->ne[1] == H && g->ne[2] == n_tokens);
        GGML_ASSERT(ggml_nelements(state) == S * S * H * n_seqs);
    }

    // concat output and new_state
    const int64_t ne[4] = { S * H, n_tokens + S * n_seqs, 1, 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    ggml_set_op_params_f32(result, 0, scale);

    result->op     = GGML_OP_GATED_LINEAR_ATTN;
    result->src[0] = k;
    result->src[1] = v;
    result->src[2] = q;
    result->src[3] = g;
    result->src[4] = state;

    return result;
}